

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

int golemhp(int type)

{
  int iVar1;
  
  iVar1 = 0;
  if (type - 0xffU < 0xc) {
    iVar1 = *(int *)(&DAT_002b2854 + (ulong)(type - 0xffU) * 4);
  }
  return iVar1;
}

Assistant:

int golemhp(int type)
{
	switch(type) {
		case PM_STRAW_GOLEM: return 20;
		case PM_PAPER_GOLEM: return 20;
		case PM_WAX_GOLEM: return 20;
		case PM_ROPE_GOLEM: return 30;
		case PM_LEATHER_GOLEM: return 40;
		case PM_GOLD_GOLEM: return 40;
		case PM_WOOD_GOLEM: return 50;
		case PM_FLESH_GOLEM: return 40;
		case PM_CLAY_GOLEM: return 50;
		case PM_STONE_GOLEM: return 60;
		case PM_GLASS_GOLEM: return 60;
		case PM_IRON_GOLEM: return 80;
		default: return 0;
	}
}